

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
insert<kj::TreeMap<kj::String,int>::Entry,kj::String&>
          (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table,size_t pos,String *params)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  size_t __n;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  ulong uVar8;
  char *__s2;
  char *__s1;
  undefined8 *in_R9;
  Maybe<unsigned_long> MVar9;
  Iterator iter;
  Iterator IStack_78;
  size_t local_60;
  size_t local_58;
  SearchKey local_50;
  StringPtr *local_48;
  size_t *local_40;
  
  local_60 = table.size_;
  local_48 = table.ptr;
  local_40 = &local_60;
  local_50._vptr_SearchKey = (_func_char_7_ **)&PTR_search_002252c0;
  local_58 = pos;
  _::BTreeImpl::insert(&IStack_78,(BTreeImpl *)&(local_48->content).size_,&local_50);
  uVar5 = (ulong)IStack_78.row;
  if (uVar5 == 0xe) {
    uVar5 = 0xe;
  }
  else {
    uVar1 = (IStack_78.leaf)->rows[uVar5].i;
    if (uVar1 != 0) {
      uVar8 = (ulong)(uVar1 - 1);
      lVar6 = uVar8 * 0x20;
      lVar2 = *(long *)(local_60 + 8 + lVar6);
      __n = lVar2 + (ulong)(lVar2 == 0);
      lVar3 = in_R9[1];
      if (__n == lVar3 + (ulong)(lVar3 == 0)) {
        __s1 = "";
        __s2 = "";
        if (lVar3 != 0) {
          __s2 = (char *)*in_R9;
        }
        if (lVar2 != 0) {
          __s1 = *(char **)(local_60 + lVar6);
        }
        iVar4 = bcmp(__s1,__s2,__n);
        if (iVar4 == 0) {
          *this = (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>)0x1;
          *(ulong *)(this + 8) = uVar8;
          aVar7 = extraout_RDX;
          goto LAB_00175d68;
        }
      }
    }
  }
  memmove((IStack_78.leaf)->rows + uVar5 + 1,(IStack_78.leaf)->rows + uVar5,
          (ulong)(IStack_78.row + 1) * -4 + 0x38);
  ((IStack_78.leaf)->rows + uVar5 + 1)[-1] = (MaybeUint)((int)params + 1);
  *this = (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>)0x0;
  aVar7 = extraout_RDX_00;
LAB_00175d68:
  MVar9.ptr.field_1.value = aVar7.value;
  MVar9.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar9.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return kj::none;
    }
  }